

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageview.cpp
# Opt level: O2

void __thiscall QtMWidgets::PageView::mouseMoveEvent(PageView *this,QMouseEvent *e)

{
  int iVar1;
  QPoint QVar2;
  QPoint QVar3;
  int delta;
  
  if (((this->d).d)->leftButtonPressed == true) {
    QVar2 = QMouseEvent::pos(e);
    iVar1 = (((this->d).d)->pos).xp;
    QVar3 = QMouseEvent::pos(e);
    ((this->d).d)->pos = QVar3;
    delta = QVar2.xp - iVar1;
    if (delta == 0 || QVar2.xp < iVar1) {
      if (delta < 0) {
        PageViewPrivate::movePageLeft((this->d).d,-delta);
      }
    }
    else {
      PageViewPrivate::movePageRight((this->d).d,delta);
    }
  }
  e[0xc] = (QMouseEvent)0x0;
  return;
}

Assistant:

void
PageView::mouseMoveEvent( QMouseEvent * e )
{
	if( d->leftButtonPressed )
	{
		const int delta = ( e->pos() - d->pos ).x();

		d->pos = e->pos();

		if( delta > 0 )
			d->movePageRight( delta );
		else if( delta < 0 )
			d->movePageLeft( qAbs( delta ) );
	}

	e->ignore();
}